

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::find_static_extensions(CompilerGLSL *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  AddressingModel AVar3;
  size_t sVar4;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  Variant *pVVar6;
  pointer ppVar7;
  Capability *pCVar8;
  ExecutionModel EVar9;
  int iVar10;
  iterator __begin2;
  SPIRType *pSVar11;
  pointer ppVar12;
  runtime_error *this_00;
  CompilerError *this_01;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  long lVar17;
  string local_68;
  size_type local_48;
  SPIREntryPoint *local_40;
  LoopLock local_38;
  
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar4 = (this->super_Compiler).ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar4 != 0) {
    pTVar5 = (this->super_Compiler).ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    paVar1 = &local_68.field_2;
    lVar17 = 0;
    do {
      uVar15 = *(uint *)((long)&pTVar5->id + lVar17);
      pVVar6 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar6[uVar15].type == TypeType) {
        pSVar11 = Variant::get<spirv_cross::SPIRType>(pVVar6 + uVar15);
        switch(pSVar11->basetype) {
        case SByte:
        case UByte:
          local_48 = 0x2c;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          local_68._M_dataplus._M_p =
               (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
          local_68.field_2._M_allocated_capacity = local_48;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1c) = 'm';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1d) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1e) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1f) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x20) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x21) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x22) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x23) = 'y';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x24) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x25) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x26) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x27) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x28) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x29) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2a) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2b) = '8';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x10) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x11) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x12) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x13) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x14) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x15) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x16) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x17) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x18) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x19) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1a) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1b) = 'h';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1c) = 'm';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1d) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1e) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1f) = 'i';
          *(undefined8 *)local_68._M_dataplus._M_p = 0x735f5458455f4c47;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 8) = 'h';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 9) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 10) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xb) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xc) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xd) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xe) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xf) = 'x';
          local_68._M_string_length = local_48;
          local_68._M_dataplus._M_p[local_48] = '\0';
          require_extension_internal(this,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((this->options).vulkan_semantics == true) {
            local_48 = 0x1a;
            local_68._M_dataplus._M_p = (pointer)paVar1;
            local_68._M_dataplus._M_p =
                 (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
            local_68.field_2._M_allocated_capacity = local_48;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 10) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xb) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xc) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xd) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xe) = '8';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xf) = 'b';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x10) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x11) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x12) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x13) = 's';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x14) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x15) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x16) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x17) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x18) = 'g';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x19) = 'e';
            *(undefined8 *)local_68._M_dataplus._M_p = 0x735f5458455f4c47;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 8) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 9) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 10) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xb) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xc) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xd) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xe) = '8';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xf) = 'b';
            local_68._M_string_length = local_48;
            local_68._M_dataplus._M_p[local_48] = '\0';
            require_extension_internal(this,&local_68);
            goto LAB_0011d7dc;
          }
          break;
        case Short:
        case UShort:
          local_48 = 0x2d;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          local_68._M_dataplus._M_p =
               (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
          local_68.field_2._M_allocated_capacity = local_48;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1d) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1e) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1f) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x20) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x21) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x22) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x23) = 'y';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x24) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x25) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x26) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x27) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x28) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x29) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2a) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2b) = '1';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2c) = '6';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x10) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x11) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x12) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x13) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x14) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x15) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x16) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x17) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x18) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x19) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1a) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1b) = 'h';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1c) = 'm';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1d) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1e) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1f) = 'i';
          *(undefined8 *)local_68._M_dataplus._M_p = 0x735f5458455f4c47;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 8) = 'h';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 9) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 10) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xb) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xc) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xd) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xe) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xf) = 'x';
          local_68._M_string_length = local_48;
          local_68._M_dataplus._M_p[local_48] = '\0';
          require_extension_internal(this,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((this->options).vulkan_semantics == true) {
            local_48 = 0x1b;
            local_68._M_dataplus._M_p = (pointer)paVar1;
            local_68._M_dataplus._M_p =
                 (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
            local_68.field_2._M_allocated_capacity = local_48;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xb) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xc) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xd) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xe) = '1';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xf) = '6';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x10) = 'b';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x11) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x12) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x13) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x14) = 's';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x15) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x16) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x17) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x18) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x19) = 'g';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x1a) = 'e';
            *(undefined8 *)local_68._M_dataplus._M_p = 0x735f5458455f4c47;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 8) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 9) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 10) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xb) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xc) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xd) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xe) = '1';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xf) = '6';
            local_68._M_string_length = local_48;
            local_68._M_dataplus._M_p[local_48] = '\0';
            require_extension_internal(this,&local_68);
            goto LAB_0011d7dc;
          }
          break;
        case Int64:
        case UInt64:
          if (((this->options).es == true) && ((this->options).version < 0x136)) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (this_00,"64-bit integers not supported in ES profile before version 310.");
LAB_0011e27c:
            *(undefined ***)this_00 = &PTR__runtime_error_0035bd08;
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_48 = 0x17;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          local_68._M_dataplus._M_p =
               (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
          local_68.field_2._M_allocated_capacity = local_48;
          *(undefined8 *)local_68._M_dataplus._M_p = 0x675f4252415f4c47;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 8) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 9) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 10) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xb) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xc) = 'h';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xd) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xe) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xf) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xf) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x10) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x11) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x12) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x13) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x14) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x15) = '6';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x16) = '4';
          local_68._M_string_length = local_48;
          local_68._M_dataplus._M_p[local_48] = '\0';
          require_extension_internal(this,&local_68);
LAB_0011d7dc:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          break;
        case Half:
          local_48 = 0x2f;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          local_68._M_dataplus._M_p =
               (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
          local_68.field_2._M_allocated_capacity = local_48;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1f) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x20) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x21) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x22) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x23) = 'y';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x24) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x25) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x26) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x27) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x28) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x29) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2a) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2b) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2c) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2d) = '1';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x2e) = '6';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x10) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x11) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x12) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x13) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x14) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x15) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x16) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x17) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x18) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x19) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1a) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1b) = 'h';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1c) = 'm';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1d) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1e) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0x1f) = 'i';
          *(undefined8 *)local_68._M_dataplus._M_p = 0x735f5458455f4c47;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 8) = 'h';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 9) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 10) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xb) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xc) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xd) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xe) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p + 0xf) = 'x';
          local_68._M_string_length = local_48;
          local_68._M_dataplus._M_p[local_48] = '\0';
          require_extension_internal(this,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((this->options).vulkan_semantics == true) {
            local_48 = 0x1b;
            local_68._M_dataplus._M_p = (pointer)paVar1;
            local_68._M_dataplus._M_p =
                 (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
            local_68.field_2._M_allocated_capacity = local_48;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xb) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xc) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xd) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xe) = '1';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xf) = '6';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x10) = 'b';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x11) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x12) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x13) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x14) = 's';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x15) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x16) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x17) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x18) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x19) = 'g';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x1a) = 'e';
            *(undefined8 *)local_68._M_dataplus._M_p = 0x735f5458455f4c47;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 8) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 9) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 10) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xb) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xc) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xd) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xe) = '1';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xf) = '6';
            local_68._M_string_length = local_48;
            local_68._M_dataplus._M_p[local_48] = '\0';
            require_extension_internal(this,&local_68);
            goto LAB_0011d7dc;
          }
          break;
        case Double:
          if ((this->options).es == true) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(this_00,"FP64 not supported in ES profile.");
            goto LAB_0011e27c;
          }
          if ((this->options).version < 400) {
            local_48 = 0x16;
            local_68._M_dataplus._M_p = (pointer)paVar1;
            local_68._M_dataplus._M_p =
                 (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
            local_68.field_2._M_allocated_capacity = local_48;
            *(undefined8 *)local_68._M_dataplus._M_p = 0x675f4252415f4c47;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 8) = 'p';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 9) = 'u';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 10) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xb) = 's';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xc) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xd) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xe) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xf) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xe) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0xf) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x10) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x11) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x12) = 'f';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x13) = 'p';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x14) = '6';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p + 0x15) = '4';
            local_68._M_string_length = local_48;
            local_68._M_dataplus._M_p[local_48] = '\0';
            require_extension_internal(this,&local_68);
            goto LAB_0011d7dc;
          }
        }
      }
      lVar17 = lVar17 + 4;
    } while (sVar4 << 2 != lVar17);
  }
  ParsedIR::LoopLock::~LoopLock(&local_38);
  local_40 = Compiler::get_entry_point(&this->super_Compiler);
  EVar9 = local_40->model;
  if ((int)EVar9 < 0x14c1) {
    if (EVar9 - ExecutionModelTessellationControl < 2) {
      bVar13 = (this->options).es;
      uVar15 = (this->options).version;
      if ((uVar15 < 0x140 & bVar13) == 1) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_EXT_tessellation_shader","");
        require_extension_internal(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        bVar13 = (this->options).es;
        uVar15 = (this->options).version;
      }
      if (((bVar13 & 1) == 0) && (uVar15 < 400)) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_ARB_tessellation_shader","");
        require_extension_internal(this,&local_68);
        goto LAB_0011dac5;
      }
    }
    else if (EVar9 == ExecutionModelGeometry) {
      bVar13 = (this->options).es;
      uVar15 = (this->options).version;
      if ((uVar15 < 0x140 & bVar13) == 1) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_EXT_geometry_shader","");
        require_extension_internal(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        bVar13 = (this->options).es;
        uVar15 = (this->options).version;
      }
      if (((bVar13 & 1) == 0) && (uVar15 < 0x96)) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_ARB_geometry_shader4","");
        require_extension_internal(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
      }
      if ((((((local_40->flags).lower & 1) != 0) && (local_40->invocations != 1)) &&
          ((this->options).es == false)) && ((this->options).version < 400)) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_ARB_gpu_shader5","");
        require_extension_internal(this,&local_68);
        goto LAB_0011dac5;
      }
    }
    else if (EVar9 == ExecutionModelGLCompute) {
      bVar13 = (this->options).es;
      uVar15 = (this->options).version;
      if (uVar15 < 0x1ae && (bool)bVar13 == false) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_ARB_compute_shader","");
        require_extension_internal(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        bVar13 = (this->options).es;
        uVar15 = (this->options).version;
      }
      if (((bVar13 & 1) != 0) && (uVar15 < 0x136)) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_01,"At least ESSL 3.10 required for compute shaders.");
        goto LAB_0011e438;
      }
    }
  }
  else {
    if (EVar9 - ExecutionModelRayGenerationKHR < 6) {
      if (((this->options).es != false) || ((this->options).version < 0x1cc)) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_01,"Ray tracing shaders require non-es profile with version 460 or above.");
        goto LAB_0011e438;
      }
      if ((this->options).vulkan_semantics == false) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_01,"Ray tracing requires Vulkan semantics.");
        goto LAB_0011e438;
      }
      sVar4 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.
              buffer_size;
      if (sVar4 != 0) {
        lVar17 = 0;
        do {
          uVar15 = *(int *)((long)(this->super_Compiler).ir.declared_capabilities.
                                  super_VectorView<spv::Capability>.ptr + lVar17) - 0x1178;
          if ((uVar15 < 8) && ((0xc1U >> (uVar15 & 0x1f) & 1) != 0)) {
            this->ray_tracing_is_khr = true;
            break;
          }
          lVar17 = lVar17 + 4;
        } while (sVar4 << 2 != lVar17);
      }
      if (this->ray_tracing_is_khr == true) {
        ray_tracing_khr_fixup_locations(this);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_EXT_ray_tracing","");
        require_extension_internal(this,&local_68);
      }
      else {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_NV_ray_tracing","");
        require_extension_internal(this,&local_68);
      }
    }
    else {
      if (1 < EVar9 - ExecutionModelTaskEXT) goto LAB_0011dad3;
      if (((this->options).es != false) || ((this->options).version < 0x1c2)) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_01,"Mesh shaders require GLSL 450 or above.");
        goto LAB_0011e438;
      }
      if ((this->options).vulkan_semantics == false) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_01,"Mesh shaders require Vulkan semantics.");
        goto LAB_0011e438;
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"GL_EXT_mesh_shader","")
      ;
      require_extension_internal(this,&local_68);
    }
LAB_0011dac5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
LAB_0011dad3:
  if (((this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (local_40->model != ExecutionModelFragment) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,"Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.");
      goto LAB_0011e438;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"GL_EXT_shader_pixel_local_storage","");
    require_extension_internal(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  ppVar12 = (this->inout_color_attachments).
            super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar7 = (this->inout_color_attachments).
           super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar12 != ppVar7) {
    if (local_40->model != ExecutionModelFragment) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,"Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.");
      goto LAB_0011e438;
    }
    if ((this->options).vulkan_semantics != false) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,"Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.");
      goto LAB_0011e438;
    }
    bVar13 = 0;
    bVar14 = 0;
    do {
      bVar13 = bVar13 | ppVar12->second;
      bVar14 = bVar14 | ppVar12->second ^ 1U;
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 != ppVar7);
    if ((bVar13 & 1) != 0) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"GL_EXT_shader_framebuffer_fetch","");
      require_extension_internal(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    if ((bVar14 & 1) != 0) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"GL_EXT_shader_framebuffer_fetch_non_coherent","");
      require_extension_internal(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
  }
  if ((((this->options).separate_shader_objects == true) && ((this->options).es == false)) &&
     ((this->options).version < 0x19a)) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"GL_ARB_separate_shader_objects","");
    require_extension_internal(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  AVar3 = (this->super_Compiler).ir.addressing_model;
  if (AVar3 != AddressingModelLogical) {
    if (AVar3 != AddressingModelPhysicalStorageBuffer64) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,
                 "Only Logical and PhysicalStorageBuffer64EXT addressing models are supported.");
      goto LAB_0011e438;
    }
    if ((this->options).vulkan_semantics == false) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,"GL_EXT_buffer_reference is only supported in Vulkan GLSL.");
      goto LAB_0011e438;
    }
    bVar2 = (this->options).es;
    uVar15 = (this->options).version;
    if ((uVar15 < 0x140 & bVar2) == 1) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"GL_EXT_buffer_reference requires ESSL 320.");
      goto LAB_0011e438;
    }
    if (bVar2 == false && uVar15 < 0x1c2) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"GL_EXT_buffer_reference requires GLSL 450.");
      goto LAB_0011e438;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"GL_EXT_buffer_reference2","");
    require_extension_internal(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  sVar4 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.
          buffer_size;
  if (sVar4 != 0) {
    pCVar8 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.ptr;
    paVar1 = &local_68.field_2;
    lVar17 = 0;
    do {
      iVar10 = *(int *)((long)pCVar8 + lVar17);
      if (iVar10 < 0x1483) {
        if (iVar10 < 0x1178) {
          if (iVar10 == 0x1157) {
            if ((this->options).vulkan_semantics == true) {
              local_68._M_dataplus._M_p = (pointer)paVar1;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_68,"GL_EXT_multiview","");
              require_extension_internal(this,&local_68);
              goto LAB_0011df97;
            }
            local_68._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"GL_OVR_multiview2","");
            require_extension_internal(this,&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar1) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if ((this->options).ovr_multiview_view_count == 0) {
              this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_01,
                         "ovr_multiview_view_count must be non-zero when using GL_OVR_multiview2.");
              goto LAB_0011e438;
            }
            EVar9 = Compiler::get_execution_model(&this->super_Compiler);
            if (EVar9 != ExecutionModelVertex) {
              this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_01,"OVR_multiview2 can only be used with Vertex shaders.");
              goto LAB_0011e438;
            }
          }
          else if (iVar10 - 0x1159U < 2) {
            this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (this_01,"VariablePointers capability is not supported in GLSL.");
            goto LAB_0011e438;
          }
        }
        else {
          if (iVar10 == 0x1178) {
            if ((((this->options).es != false) || ((this->options).version < 0x1cc)) ||
               ((this->options).vulkan_semantics == false)) {
              this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(this_01,"RayQuery requires Vulkan GLSL 460.");
              goto LAB_0011e438;
            }
            local_68._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"GL_EXT_ray_query","");
            require_extension_internal(this,&local_68);
          }
          else {
            if (iVar10 != 0x117e) goto LAB_0011dfa5;
            if ((((this->options).es != false) || ((this->options).version < 0x1cc)) ||
               ((this->options).vulkan_semantics == false)) {
              this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(this_01,"RayQuery requires Vulkan GLSL 460.");
              goto LAB_0011e438;
            }
            local_68._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"GL_EXT_ray_flags_primitive_culling","");
            require_extension_internal(this,&local_68);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          this->ray_tracing_is_khr = true;
        }
      }
      else if (iVar10 == 0x1483) {
        if (local_40->model == ExecutionModelGeometry) {
          local_68._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"GL_NV_geometry_shader_passthrough","");
          require_extension_internal(this,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          local_40->geometry_passthrough = true;
        }
      }
      else {
        if (iVar10 == 0x14b6) {
          if ((this->options).vulkan_semantics == false) {
            this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (this_01,"GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.");
            goto LAB_0011e438;
          }
          local_68._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"GL_EXT_nonuniform_qualifier","");
          require_extension_internal(this,&local_68);
        }
        else {
          if (iVar10 != 0x14b5) goto LAB_0011dfa5;
          if ((this->options).vulkan_semantics == false) {
            local_68._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"GL_NV_gpu_shader5","");
            require_extension_internal(this,&local_68);
          }
          else {
            local_68._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"GL_EXT_nonuniform_qualifier","");
            require_extension_internal(this,&local_68);
          }
        }
LAB_0011df97:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p);
        }
      }
LAB_0011dfa5:
      lVar17 = lVar17 + 4;
    } while (sVar4 << 2 != lVar17);
  }
  if ((this->options).ovr_multiview_view_count != 0) {
    if ((this->options).vulkan_semantics == true) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"OVR_multiview2 cannot be used with Vulkan semantics.");
    }
    else {
      EVar9 = Compiler::get_execution_model(&this->super_Compiler);
      if (EVar9 == ExecutionModelVertex) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_OVR_multiview2","");
        require_extension_internal(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        goto LAB_0011e03d;
      }
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"OVR_multiview2 can only be used with Vertex shaders.");
    }
LAB_0011e438:
    __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_0011e03d:
  sVar4 = (this->super_Compiler).ir.declared_extensions.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size;
  if (sVar4 != 0) {
    pbVar16 = (this->super_Compiler).ir.declared_extensions.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr;
    lVar17 = sVar4 << 5;
    do {
      iVar10 = ::std::__cxx11::string::compare((char *)pbVar16);
      if (iVar10 == 0) {
        this->barycentric_is_nv = true;
      }
      pbVar16 = pbVar16 + 1;
      lVar17 = lVar17 + -0x20;
    } while (lVar17 != 0);
  }
  return;
}

Assistant:

void CompilerGLSL::find_static_extensions()
{
	ir.for_each_typed_id<SPIRType>([&](uint32_t, const SPIRType &type) {
		if (type.basetype == SPIRType::Double)
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");
		}
		else if (type.basetype == SPIRType::Int64 || type.basetype == SPIRType::UInt64)
		{
			if (options.es && options.version < 310) // GL_NV_gpu_shader5 fallback requires 310.
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile before version 310.");
			require_extension_internal("GL_ARB_gpu_shader_int64");
		}
		else if (type.basetype == SPIRType::Half)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_float16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
		else if (type.basetype == SPIRType::SByte || type.basetype == SPIRType::UByte)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int8");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_8bit_storage");
		}
		else if (type.basetype == SPIRType::Short || type.basetype == SPIRType::UShort)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
	});

	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelGLCompute:
		if (!options.es && options.version < 430)
			require_extension_internal("GL_ARB_compute_shader");
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for compute shaders.");
		break;

	case ExecutionModelGeometry:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_geometry_shader");
		if (!options.es && options.version < 150)
			require_extension_internal("GL_ARB_geometry_shader4");

		if (execution.flags.get(ExecutionModeInvocations) && execution.invocations != 1)
		{
			// Instanced GS is part of 400 core or this extension.
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader5");
		}
		break;

	case ExecutionModelTessellationEvaluation:
	case ExecutionModelTessellationControl:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_tessellation_shader");
		if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_tessellation_shader");
		break;

	case ExecutionModelRayGenerationKHR:
	case ExecutionModelIntersectionKHR:
	case ExecutionModelAnyHitKHR:
	case ExecutionModelClosestHitKHR:
	case ExecutionModelMissKHR:
	case ExecutionModelCallableKHR:
		// NV enums are aliases.
		if (options.es || options.version < 460)
			SPIRV_CROSS_THROW("Ray tracing shaders require non-es profile with version 460 or above.");
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Ray tracing requires Vulkan semantics.");

		// Need to figure out if we should target KHR or NV extension based on capabilities.
		for (auto &cap : ir.declared_capabilities)
		{
			if (cap == CapabilityRayTracingKHR || cap == CapabilityRayQueryKHR ||
			    cap == CapabilityRayTraversalPrimitiveCullingKHR)
			{
				ray_tracing_is_khr = true;
				break;
			}
		}

		if (ray_tracing_is_khr)
		{
			// In KHR ray tracing we pass payloads by pointer instead of location,
			// so make sure we assign locations properly.
			ray_tracing_khr_fixup_locations();
			require_extension_internal("GL_EXT_ray_tracing");
		}
		else
			require_extension_internal("GL_NV_ray_tracing");
		break;

	case ExecutionModelMeshEXT:
	case ExecutionModelTaskEXT:
		if (options.es || options.version < 450)
			SPIRV_CROSS_THROW("Mesh shaders require GLSL 450 or above.");
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Mesh shaders require Vulkan semantics.");
		require_extension_internal("GL_EXT_mesh_shader");
		break;

	default:
		break;
	}

	if (!pls_inputs.empty() || !pls_outputs.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.");
		require_extension_internal("GL_EXT_shader_pixel_local_storage");
	}

	if (!inout_color_attachments.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.");
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.");

		bool has_coherent = false;
		bool has_incoherent = false;

		for (auto &att : inout_color_attachments)
		{
			if (att.second)
				has_coherent = true;
			else
				has_incoherent = true;
		}

		if (has_coherent)
			require_extension_internal("GL_EXT_shader_framebuffer_fetch");
		if (has_incoherent)
			require_extension_internal("GL_EXT_shader_framebuffer_fetch_non_coherent");
	}

	if (options.separate_shader_objects && !options.es && options.version < 410)
		require_extension_internal("GL_ARB_separate_shader_objects");

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference is only supported in Vulkan GLSL.");
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires GLSL 450.");
		require_extension_internal("GL_EXT_buffer_reference2");
	}
	else if (ir.addressing_model != AddressingModelLogical)
	{
		SPIRV_CROSS_THROW("Only Logical and PhysicalStorageBuffer64EXT addressing models are supported.");
	}

	// Check for nonuniform qualifier and passthrough.
	// Instead of looping over all decorations to find this, just look at capabilities.
	for (auto &cap : ir.declared_capabilities)
	{
		switch (cap)
		{
		case CapabilityShaderNonUniformEXT:
			if (!options.vulkan_semantics)
				require_extension_internal("GL_NV_gpu_shader5");
			else
				require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;
		case CapabilityRuntimeDescriptorArrayEXT:
			if (!options.vulkan_semantics)
				SPIRV_CROSS_THROW("GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.");
			require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;

		case CapabilityGeometryShaderPassthroughNV:
			if (execution.model == ExecutionModelGeometry)
			{
				require_extension_internal("GL_NV_geometry_shader_passthrough");
				execution.geometry_passthrough = true;
			}
			break;

		case CapabilityVariablePointers:
		case CapabilityVariablePointersStorageBuffer:
			SPIRV_CROSS_THROW("VariablePointers capability is not supported in GLSL.");

		case CapabilityMultiView:
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_multiview");
			else
			{
				require_extension_internal("GL_OVR_multiview2");
				if (options.ovr_multiview_view_count == 0)
					SPIRV_CROSS_THROW("ovr_multiview_view_count must be non-zero when using GL_OVR_multiview2.");
				if (get_execution_model() != ExecutionModelVertex)
					SPIRV_CROSS_THROW("OVR_multiview2 can only be used with Vertex shaders.");
			}
			break;

		case CapabilityRayQueryKHR:
			if (options.es || options.version < 460 || !options.vulkan_semantics)
				SPIRV_CROSS_THROW("RayQuery requires Vulkan GLSL 460.");
			require_extension_internal("GL_EXT_ray_query");
			ray_tracing_is_khr = true;
			break;

		case CapabilityRayTraversalPrimitiveCullingKHR:
			if (options.es || options.version < 460 || !options.vulkan_semantics)
				SPIRV_CROSS_THROW("RayQuery requires Vulkan GLSL 460.");
			require_extension_internal("GL_EXT_ray_flags_primitive_culling");
			ray_tracing_is_khr = true;
			break;

		default:
			break;
		}
	}

	if (options.ovr_multiview_view_count)
	{
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("OVR_multiview2 cannot be used with Vulkan semantics.");
		if (get_execution_model() != ExecutionModelVertex)
			SPIRV_CROSS_THROW("OVR_multiview2 can only be used with Vertex shaders.");
		require_extension_internal("GL_OVR_multiview2");
	}

	// KHR one is likely to get promoted at some point, so if we don't see an explicit SPIR-V extension, assume KHR.
	for (auto &ext : ir.declared_extensions)
		if (ext == "SPV_NV_fragment_shader_barycentric")
			barycentric_is_nv = true;
}